

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx.cpp
# Opt level: O1

void ncnn::quantize_pack4to1
               (float *ptr,char *s8ptr0,char *s8ptr1,char *s8ptr2,char *s8ptr3,Mat *scale_data,
               int elemcount)

{
  float *pfVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  undefined1 auVar5 [12];
  uint uVar6;
  long lVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  short sVar13;
  undefined4 uVar14;
  short sVar26;
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ushort uVar27;
  undefined2 uVar28;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ushort uVar44;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ushort uVar54;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ushort uVar64;
  undefined1 auVar57 [16];
  undefined1 auVar17 [16];
  undefined1 auVar15 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined6 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar37 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  pfVar1 = (float *)scale_data->data;
  if (scale_data->w < 2) {
    fVar9 = *pfVar1;
    fVar10 = fVar9;
    fVar11 = fVar9;
    fVar12 = fVar9;
  }
  else {
    fVar9 = *pfVar1;
    fVar10 = pfVar1[1];
    fVar11 = pfVar1[2];
    fVar12 = pfVar1[3];
  }
  uVar6 = 0;
  if (7 < elemcount) {
    uVar6 = elemcount & 0x7ffffff8;
    iVar8 = 7;
    do {
      auVar33._0_4_ = (int)((float)((uint)(*ptr * fVar9) & 0x80000000 | 0x3f000000) + *ptr * fVar9);
      auVar33._4_4_ =
           (int)((float)((uint)(ptr[1] * fVar10) & 0x80000000 | 0x3f000000) + ptr[1] * fVar10);
      auVar33._8_4_ =
           (int)((float)((uint)(ptr[2] * fVar11) & 0x80000000 | 0x3f000000) + ptr[2] * fVar11);
      auVar33._12_4_ =
           (int)((float)((uint)(ptr[3] * fVar12) & 0x80000000 | 0x3f000000) + ptr[3] * fVar12);
      auVar53._0_4_ =
           (int)((float)((uint)(ptr[0x10] * fVar9) & 0x80000000 | 0x3f000000) + ptr[0x10] * fVar9);
      auVar53._4_4_ =
           (int)((float)((uint)(ptr[0x11] * fVar10) & 0x80000000 | 0x3f000000) + ptr[0x11] * fVar10)
      ;
      auVar53._8_4_ =
           (int)((float)((uint)(ptr[0x12] * fVar11) & 0x80000000 | 0x3f000000) + ptr[0x12] * fVar11)
      ;
      auVar53._12_4_ =
           (int)((float)((uint)(ptr[0x13] * fVar12) & 0x80000000 | 0x3f000000) + ptr[0x13] * fVar12)
      ;
      auVar34 = packssdw(auVar33,auVar53);
      auVar55._0_4_ =
           (int)((float)((uint)(ptr[8] * fVar9) & 0x80000000 | 0x3f000000) + ptr[8] * fVar9);
      auVar55._4_4_ =
           (int)((float)((uint)(ptr[9] * fVar10) & 0x80000000 | 0x3f000000) + ptr[9] * fVar10);
      auVar55._8_4_ =
           (int)((float)((uint)(ptr[10] * fVar11) & 0x80000000 | 0x3f000000) + ptr[10] * fVar11);
      auVar55._12_4_ =
           (int)((float)((uint)(ptr[0xb] * fVar12) & 0x80000000 | 0x3f000000) + ptr[0xb] * fVar12);
      auVar49._0_4_ =
           (int)((float)((uint)(ptr[0x18] * fVar9) & 0x80000000 | 0x3f000000) + ptr[0x18] * fVar9);
      auVar49._4_4_ =
           (int)((float)((uint)(ptr[0x19] * fVar10) & 0x80000000 | 0x3f000000) + ptr[0x19] * fVar10)
      ;
      auVar49._8_4_ =
           (int)((float)((uint)(ptr[0x1a] * fVar11) & 0x80000000 | 0x3f000000) + ptr[0x1a] * fVar11)
      ;
      auVar49._12_4_ =
           (int)((float)((uint)(ptr[0x1b] * fVar12) & 0x80000000 | 0x3f000000) + ptr[0x1b] * fVar12)
      ;
      auVar56 = packssdw(auVar55,auVar49);
      sVar13 = auVar34._0_2_;
      uVar27 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._2_2_;
      uVar38 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._4_2_;
      uVar39 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._6_2_;
      uVar40 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._8_2_;
      uVar41 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._10_2_;
      uVar42 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._12_2_;
      sVar26 = auVar34._14_2_;
      uVar43 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      uVar44 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      sVar13 = auVar56._0_2_;
      uVar54 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar56._2_2_;
      uVar58 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar56._4_2_;
      uVar59 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar56._6_2_;
      uVar60 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar56._8_2_;
      uVar61 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar56._10_2_;
      uVar62 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar56._12_2_;
      sVar26 = auVar56._14_2_;
      uVar63 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      uVar64 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      auVar35._0_2_ = (ushort)((short)uVar27 < -0x7f) * -0x7f | ((short)uVar27 >= -0x7f) * uVar27;
      auVar35._2_2_ = (ushort)((short)uVar38 < -0x7f) * -0x7f | ((short)uVar38 >= -0x7f) * uVar38;
      auVar35._4_2_ = (ushort)((short)uVar39 < -0x7f) * -0x7f | ((short)uVar39 >= -0x7f) * uVar39;
      auVar35._6_2_ = (ushort)((short)uVar40 < -0x7f) * -0x7f | ((short)uVar40 >= -0x7f) * uVar40;
      auVar35._8_2_ = (ushort)((short)uVar41 < -0x7f) * -0x7f | ((short)uVar41 >= -0x7f) * uVar41;
      auVar35._10_2_ = (ushort)((short)uVar42 < -0x7f) * -0x7f | ((short)uVar42 >= -0x7f) * uVar42;
      auVar35._12_2_ = (ushort)((short)uVar43 < -0x7f) * -0x7f | ((short)uVar43 >= -0x7f) * uVar43;
      auVar35._14_2_ = (ushort)((short)uVar44 < -0x7f) * -0x7f | ((short)uVar44 >= -0x7f) * uVar44;
      auVar57._0_2_ = (ushort)((short)uVar54 < -0x7f) * -0x7f | ((short)uVar54 >= -0x7f) * uVar54;
      auVar57._2_2_ = (ushort)((short)uVar58 < -0x7f) * -0x7f | ((short)uVar58 >= -0x7f) * uVar58;
      auVar57._4_2_ = (ushort)((short)uVar59 < -0x7f) * -0x7f | ((short)uVar59 >= -0x7f) * uVar59;
      auVar57._6_2_ = (ushort)((short)uVar60 < -0x7f) * -0x7f | ((short)uVar60 >= -0x7f) * uVar60;
      auVar57._8_2_ = (ushort)((short)uVar61 < -0x7f) * -0x7f | ((short)uVar61 >= -0x7f) * uVar61;
      auVar57._10_2_ = (ushort)((short)uVar62 < -0x7f) * -0x7f | ((short)uVar62 >= -0x7f) * uVar62;
      auVar57._12_2_ = (ushort)((short)uVar63 < -0x7f) * -0x7f | ((short)uVar63 >= -0x7f) * uVar63;
      auVar57._14_2_ = (ushort)((short)uVar64 < -0x7f) * -0x7f | ((short)uVar64 >= -0x7f) * uVar64;
      auVar36 = packsswb(auVar35,auVar57);
      auVar50._0_4_ =
           (int)((float)((uint)(ptr[4] * fVar9) & 0x80000000 | 0x3f000000) + ptr[4] * fVar9);
      auVar50._4_4_ =
           (int)((float)((uint)(ptr[5] * fVar10) & 0x80000000 | 0x3f000000) + ptr[5] * fVar10);
      auVar50._8_4_ =
           (int)((float)((uint)(ptr[6] * fVar11) & 0x80000000 | 0x3f000000) + ptr[6] * fVar11);
      auVar50._12_4_ =
           (int)((float)((uint)(ptr[7] * fVar12) & 0x80000000 | 0x3f000000) + ptr[7] * fVar12);
      auVar34._0_4_ =
           (int)((float)((uint)(ptr[0x14] * fVar9) & 0x80000000 | 0x3f000000) + ptr[0x14] * fVar9);
      auVar34._4_4_ =
           (int)((float)((uint)(ptr[0x15] * fVar10) & 0x80000000 | 0x3f000000) + ptr[0x15] * fVar10)
      ;
      auVar34._8_4_ =
           (int)((float)((uint)(ptr[0x16] * fVar11) & 0x80000000 | 0x3f000000) + ptr[0x16] * fVar11)
      ;
      auVar34._12_4_ =
           (int)((float)((uint)(ptr[0x17] * fVar12) & 0x80000000 | 0x3f000000) + ptr[0x17] * fVar12)
      ;
      auVar51 = packssdw(auVar50,auVar34);
      auVar56._0_4_ =
           (int)((float)((uint)(ptr[0xc] * fVar9) & 0x80000000 | 0x3f000000) + ptr[0xc] * fVar9);
      auVar56._4_4_ =
           (int)((float)((uint)(ptr[0xd] * fVar10) & 0x80000000 | 0x3f000000) + ptr[0xd] * fVar10);
      auVar56._8_4_ =
           (int)((float)((uint)(ptr[0xe] * fVar11) & 0x80000000 | 0x3f000000) + ptr[0xe] * fVar11);
      auVar56._12_4_ =
           (int)((float)((uint)(ptr[0xf] * fVar12) & 0x80000000 | 0x3f000000) + ptr[0xf] * fVar12);
      auVar45._0_4_ =
           (int)((float)((uint)(ptr[0x1c] * fVar9) & 0x80000000 | 0x3f000000) + ptr[0x1c] * fVar9);
      auVar45._4_4_ =
           (int)((float)((uint)(ptr[0x1d] * fVar10) & 0x80000000 | 0x3f000000) + ptr[0x1d] * fVar10)
      ;
      auVar45._8_4_ =
           (int)((float)((uint)(ptr[0x1e] * fVar11) & 0x80000000 | 0x3f000000) + ptr[0x1e] * fVar11)
      ;
      auVar45._12_4_ =
           (int)((float)((uint)(ptr[0x1f] * fVar12) & 0x80000000 | 0x3f000000) + ptr[0x1f] * fVar12)
      ;
      auVar34 = packssdw(auVar56,auVar45);
      sVar13 = auVar51._0_2_;
      uVar54 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar51._2_2_;
      uVar58 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar51._4_2_;
      uVar59 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar51._6_2_;
      uVar60 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar51._8_2_;
      uVar61 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar51._10_2_;
      uVar62 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar51._12_2_;
      sVar26 = auVar51._14_2_;
      uVar63 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      uVar64 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      sVar13 = auVar34._0_2_;
      uVar27 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._2_2_;
      uVar38 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._4_2_;
      uVar39 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._6_2_;
      uVar40 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._8_2_;
      uVar41 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._10_2_;
      uVar42 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._12_2_;
      sVar26 = auVar34._14_2_;
      uVar43 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      uVar44 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      auVar52._0_2_ = (ushort)((short)uVar54 < -0x7f) * -0x7f | ((short)uVar54 >= -0x7f) * uVar54;
      auVar52._2_2_ = (ushort)((short)uVar58 < -0x7f) * -0x7f | ((short)uVar58 >= -0x7f) * uVar58;
      auVar52._4_2_ = (ushort)((short)uVar59 < -0x7f) * -0x7f | ((short)uVar59 >= -0x7f) * uVar59;
      auVar52._6_2_ = (ushort)((short)uVar60 < -0x7f) * -0x7f | ((short)uVar60 >= -0x7f) * uVar60;
      auVar52._8_2_ = (ushort)((short)uVar61 < -0x7f) * -0x7f | ((short)uVar61 >= -0x7f) * uVar61;
      auVar52._10_2_ = (ushort)((short)uVar62 < -0x7f) * -0x7f | ((short)uVar62 >= -0x7f) * uVar62;
      auVar52._12_2_ = (ushort)((short)uVar63 < -0x7f) * -0x7f | ((short)uVar63 >= -0x7f) * uVar63;
      auVar52._14_2_ = (ushort)((short)uVar64 < -0x7f) * -0x7f | ((short)uVar64 >= -0x7f) * uVar64;
      auVar51._0_2_ = (ushort)((short)uVar27 < -0x7f) * -0x7f | ((short)uVar27 >= -0x7f) * uVar27;
      auVar51._2_2_ = (ushort)((short)uVar38 < -0x7f) * -0x7f | ((short)uVar38 >= -0x7f) * uVar38;
      auVar51._4_2_ = (ushort)((short)uVar39 < -0x7f) * -0x7f | ((short)uVar39 >= -0x7f) * uVar39;
      auVar51._6_2_ = (ushort)((short)uVar40 < -0x7f) * -0x7f | ((short)uVar40 >= -0x7f) * uVar40;
      auVar51._8_2_ = (ushort)((short)uVar41 < -0x7f) * -0x7f | ((short)uVar41 >= -0x7f) * uVar41;
      auVar51._10_2_ = (ushort)((short)uVar42 < -0x7f) * -0x7f | ((short)uVar42 >= -0x7f) * uVar42;
      auVar51._12_2_ = (ushort)((short)uVar43 < -0x7f) * -0x7f | ((short)uVar43 >= -0x7f) * uVar43;
      auVar51._14_2_ = (ushort)((short)uVar44 < -0x7f) * -0x7f | ((short)uVar44 >= -0x7f) * uVar44;
      auVar34 = packsswb(auVar52,auVar51);
      auVar23._0_14_ = auVar36._0_14_;
      auVar23[0xe] = auVar36[7];
      auVar23[0xf] = auVar34[7];
      auVar22._14_2_ = auVar23._14_2_;
      auVar22._0_13_ = auVar36._0_13_;
      auVar22[0xd] = auVar34[6];
      auVar21._13_3_ = auVar22._13_3_;
      auVar21._0_12_ = auVar36._0_12_;
      auVar21[0xc] = auVar36[6];
      auVar20._12_4_ = auVar21._12_4_;
      auVar20._0_11_ = auVar36._0_11_;
      auVar20[0xb] = auVar34[5];
      auVar19._11_5_ = auVar20._11_5_;
      auVar19._0_10_ = auVar36._0_10_;
      auVar19[10] = auVar36[5];
      auVar18._10_6_ = auVar19._10_6_;
      auVar18._0_9_ = auVar36._0_9_;
      auVar18[9] = auVar34[4];
      auVar17._9_7_ = auVar18._9_7_;
      auVar17._0_8_ = auVar36._0_8_;
      auVar17[8] = auVar36[4];
      Var4 = CONCAT91(CONCAT81(auVar17._8_8_,auVar34[3]),auVar36[3]);
      auVar3._2_10_ = Var4;
      auVar3[1] = auVar34[2];
      auVar3[0] = auVar36[2];
      auVar2._2_12_ = auVar3;
      auVar2[1] = auVar34[1];
      auVar2[0] = auVar36[1];
      auVar16._0_2_ = CONCAT11(auVar34[0],auVar36[0]);
      auVar16._2_14_ = auVar2;
      uVar28 = CONCAT11(auVar34[8],auVar36[8]);
      uVar14 = CONCAT13(auVar34[9],CONCAT12(auVar36[9],uVar28));
      uVar29 = CONCAT15(auVar34[10],CONCAT14(auVar36[10],uVar14));
      uVar30 = CONCAT17(auVar34[0xb],CONCAT16(auVar36[0xb],uVar29));
      auVar31._0_10_ = CONCAT19(auVar34[0xc],CONCAT18(auVar36[0xc],uVar30));
      auVar31[10] = auVar36[0xd];
      auVar31[0xb] = auVar34[0xd];
      auVar32[0xc] = auVar36[0xe];
      auVar32._0_12_ = auVar31;
      auVar32[0xd] = auVar34[0xe];
      auVar37[0xe] = auVar36[0xf];
      auVar37._0_14_ = auVar32;
      auVar37[0xf] = auVar34[0xf];
      auVar48._0_12_ = auVar16._0_12_;
      auVar48._12_2_ = (short)Var4;
      auVar48._14_2_ = (short)((ulong)uVar30 >> 0x30);
      auVar47._12_4_ = auVar48._12_4_;
      auVar47._0_10_ = auVar16._0_10_;
      auVar47._10_2_ = (short)((uint6)uVar29 >> 0x20);
      auVar46._10_6_ = auVar47._10_6_;
      auVar46._0_8_ = auVar16._0_8_;
      auVar46._8_2_ = auVar3._0_2_;
      auVar5._4_8_ = auVar46._8_8_;
      auVar5._2_2_ = (short)((uint)uVar14 >> 0x10);
      auVar5._0_2_ = auVar2._0_2_;
      uVar14 = CONCAT22((short)((unkuint10)auVar31._0_10_ >> 0x40),auVar17._8_2_);
      auVar15._0_8_ = CONCAT26(auVar31._10_2_,CONCAT24(auVar19._10_2_,uVar14));
      auVar15._8_2_ = auVar21._12_2_;
      auVar15._10_2_ = auVar32._12_2_;
      auVar36._12_2_ = auVar22._14_2_;
      auVar36._0_12_ = auVar15;
      auVar36._14_2_ = auVar37._14_2_;
      *(ulong *)s8ptr0 = CONCAT44(uVar14,CONCAT22(uVar28,auVar16._0_2_));
      *(ulong *)s8ptr1 = CONCAT44((int)((ulong)auVar15._0_8_ >> 0x20),auVar5._0_4_);
      *(ulong *)s8ptr2 = CONCAT44(auVar15._8_4_,auVar46._8_4_);
      *(ulong *)s8ptr3 = CONCAT44(auVar36._12_4_,auVar47._12_4_);
      ptr = ptr + 0x20;
      s8ptr0 = s8ptr0 + 8;
      s8ptr1 = s8ptr1 + 8;
      s8ptr2 = s8ptr2 + 8;
      s8ptr3 = s8ptr3 + 8;
      iVar8 = iVar8 + 8;
    } while (iVar8 < elemcount);
  }
  if ((int)uVar6 < elemcount) {
    lVar7 = 0;
    do {
      auVar24._0_4_ = (int)((float)((uint)(*ptr * fVar9) & 0x80000000 | 0x3f000000) + *ptr * fVar9);
      auVar24._4_4_ =
           (int)((float)((uint)(ptr[1] * fVar10) & 0x80000000 | 0x3f000000) + ptr[1] * fVar10);
      auVar24._8_4_ =
           (int)((float)((uint)(ptr[2] * fVar11) & 0x80000000 | 0x3f000000) + ptr[2] * fVar11);
      auVar24._12_4_ =
           (int)((float)((uint)(ptr[3] * fVar12) & 0x80000000 | 0x3f000000) + ptr[3] * fVar12);
      auVar34 = packssdw(auVar24,auVar24);
      sVar13 = auVar34._0_2_;
      uVar27 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._2_2_;
      uVar38 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._4_2_;
      uVar39 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._6_2_;
      uVar40 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._8_2_;
      uVar41 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._10_2_;
      uVar42 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      sVar13 = auVar34._12_2_;
      sVar26 = auVar34._14_2_;
      uVar43 = (ushort)(0x7f < sVar13) * 0x7f | (ushort)(0x7f >= sVar13) * sVar13;
      uVar44 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      auVar25._0_2_ = (ushort)((short)uVar27 < -0x7f) * -0x7f | ((short)uVar27 >= -0x7f) * uVar27;
      auVar25._2_2_ = (ushort)((short)uVar38 < -0x7f) * -0x7f | ((short)uVar38 >= -0x7f) * uVar38;
      auVar25._4_2_ = (ushort)((short)uVar39 < -0x7f) * -0x7f | ((short)uVar39 >= -0x7f) * uVar39;
      auVar25._6_2_ = (ushort)((short)uVar40 < -0x7f) * -0x7f | ((short)uVar40 >= -0x7f) * uVar40;
      auVar25._8_2_ = (ushort)((short)uVar41 < -0x7f) * -0x7f | ((short)uVar41 >= -0x7f) * uVar41;
      auVar25._10_2_ = (ushort)((short)uVar42 < -0x7f) * -0x7f | ((short)uVar42 >= -0x7f) * uVar42;
      auVar25._12_2_ = (ushort)((short)uVar43 < -0x7f) * -0x7f | ((short)uVar43 >= -0x7f) * uVar43;
      auVar25._14_2_ = (ushort)((short)uVar44 < -0x7f) * -0x7f | ((short)uVar44 >= -0x7f) * uVar44;
      auVar34 = packsswb(auVar25,auVar25);
      s8ptr0[lVar7] = auVar34[4];
      s8ptr1[lVar7] = auVar34[5];
      s8ptr2[lVar7] = auVar34[6];
      s8ptr3[lVar7] = auVar34[7];
      ptr = ptr + 4;
      lVar7 = lVar7 + 1;
    } while (elemcount - uVar6 != (int)lVar7);
  }
  return;
}

Assistant:

static void quantize_pack4to1(const float* ptr, signed char* s8ptr0, signed char* s8ptr1, signed char* s8ptr2, signed char* s8ptr3, const Mat& scale_data, int elemcount)
{
    const int scale_data_size = scale_data.w;

    // NCNN_LOGE("quantize_pack4to1 %d   %d", scale_data_size, elemcount);

    float scale = scale_data[0];
    __m128 _scale = _mm_set1_ps(scale);
    if (scale_data_size > 1)
    {
        _scale = _mm_loadu_ps((const float*)scale_data);
    }

    int i = 0;
    for (; i + 7 < elemcount; i += 8)
    {
        __m128 _v0 = _mm_loadu_ps(ptr);
        __m128 _v1 = _mm_loadu_ps(ptr + 4);
        __m128 _v2 = _mm_loadu_ps(ptr + 8);
        __m128 _v3 = _mm_loadu_ps(ptr + 12);
        __m128 _v4 = _mm_loadu_ps(ptr + 16);
        __m128 _v5 = _mm_loadu_ps(ptr + 20);
        __m128 _v6 = _mm_loadu_ps(ptr + 24);
        __m128 _v7 = _mm_loadu_ps(ptr + 28);
        _v0 = _mm_mul_ps(_v0, _scale);
        _v1 = _mm_mul_ps(_v1, _scale);
        _v2 = _mm_mul_ps(_v2, _scale);
        _v3 = _mm_mul_ps(_v3, _scale);
        _v4 = _mm_mul_ps(_v4, _scale);
        _v5 = _mm_mul_ps(_v5, _scale);
        _v6 = _mm_mul_ps(_v6, _scale);
        _v7 = _mm_mul_ps(_v7, _scale);
        __m128i v0426 = float2int8_sse(_v0, _v4, _v2, _v6);
        __m128i v1537 = float2int8_sse(_v1, _v5, _v3, _v7);
        __m128i v0145 = _mm_unpacklo_epi8(v0426, v1537);
        __m128i v2367 = _mm_unpackhi_epi8(v0426, v1537);
        __m128i v0123 = _mm_unpacklo_epi16(v0145, v2367);
        __m128i v4567 = _mm_unpackhi_epi16(v0145, v2367);
        __m128i v01 = _mm_unpacklo_epi32(v0123, v4567);
        __m128i v23 = _mm_unpackhi_epi32(v0123, v4567);
        _mm_storel_pd((double*)s8ptr0, _mm_castsi128_pd(v01));
        _mm_storeh_pd((double*)s8ptr1, _mm_castsi128_pd(v01));
        _mm_storel_pd((double*)s8ptr2, _mm_castsi128_pd(v23));
        _mm_storeh_pd((double*)s8ptr3, _mm_castsi128_pd(v23));
        ptr += 32;
        s8ptr0 += 8;
        s8ptr1 += 8;
        s8ptr2 += 8;
        s8ptr3 += 8;
    }
    for (; i < elemcount; i++)
    {
        __m128 _v = _mm_loadu_ps(ptr);
        _v = _mm_mul_ps(_v, _scale);
        int64_t v = float2int8_sse(_v, _v);
        s8ptr0[0] = (v >> 32) & 0xff;
        s8ptr1[0] = (v >> 40) & 0xff;
        s8ptr2[0] = (v >> 48) & 0xff;
        s8ptr3[0] = (v >> 56) & 0xff;
        ptr += 4;
        s8ptr0 += 1;
        s8ptr1 += 1;
        s8ptr2 += 1;
        s8ptr3 += 1;
    }
}